

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QFileDialogPrivate::HistoryItem>::copyAppend
          (QGenericArrayOps<QFileDialogPrivate::HistoryItem> *this,HistoryItem *b,HistoryItem *e)

{
  qsizetype *pqVar1;
  HistoryItem *pHVar2;
  long lVar3;
  Data *pDVar4;
  Data *pDVar5;
  
  if ((b != e) && (b < e)) {
    pHVar2 = (this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).size;
      pDVar4 = (b->path).d.d;
      pHVar2[lVar3].path.d.d = pDVar4;
      pHVar2[lVar3].path.d.ptr = (b->path).d.ptr;
      pHVar2[lVar3].path.d.size = (b->path).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar5 = (b->selection).d.d;
      pHVar2[lVar3].selection.d.d = pDVar5;
      pHVar2[lVar3].selection.d.ptr = (b->selection).d.ptr;
      pHVar2[lVar3].selection.d.size = (b->selection).d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QFileDialogPrivate::HistoryItem>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }